

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void mg_send_file_internal
               (mg_connection *c,char *file_name,file_stat_t *st,int exists,char *extra_headers)

{
  void **conn;
  uint *puVar1;
  byte bVar2;
  void *pvVar3;
  ulong uVar4;
  undefined8 uVar5;
  double dVar6;
  dir_entry *__ptr;
  int iVar7;
  __pid_t _Var8;
  uint uVar9;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  FILE *__stream;
  byte *pbVar13;
  __int32_t **pp_Var14;
  ns_connection *pnVar15;
  tm *__tp;
  int *piVar16;
  file_stat_t *st_00;
  time_t *extraout_RDX;
  undefined8 extraout_RDX_00;
  time_t *t;
  time_t *extraout_RDX_01;
  time_t *t_00;
  file_stat_t *st_01;
  char *pcVar17;
  size_t sVar18;
  long lVar19;
  file_stat_t *buf_len;
  ulong uVar20;
  long lVar21;
  long lVar22;
  __time_t *__timer;
  bool bVar23;
  undefined4 uVar24;
  char *local_a308;
  time_t curtime;
  char *local_a2f8;
  file_stat_t *local_a2f0;
  int day;
  undefined4 uStack_a2e4;
  uint local_a2e0;
  int64_t r1;
  char *local_a2d0;
  char *local_a2c8;
  int64_t r2;
  int minute;
  int iStack_a2b4;
  int hour;
  int second;
  char cStack_a039;
  char path [8192];
  char dir [8192];
  file_stat_t st_1;
  undefined8 local_4030 [64];
  undefined8 local_3e30;
  
  uVar9 = st->st_mode;
  conn = &c[-1].callback_param;
  pcVar17 = *(char **)(c[1].request_method + 0x58);
  local_a2c8 = *(char **)(c[1].request_method + 0x70);
  mg_snprintf(path,0x2000,"%s",file_name);
  if (exists != 0) {
    iVar7 = must_hide_file((connection *)conn,path);
    if (iVar7 == 0) {
      if ((uVar9 & 0xf000) == 0x4000) {
        pcVar11 = c->uri;
        sVar10 = strlen(pcVar11);
        if (pcVar11[sVar10 - 1] != '/') {
          c->status_code = 0x12d;
          mg_printf(c,"HTTP/1.1 301 Moved Permanently\r\nLocation: %s/\r\n\r\n",pcVar11);
          goto LAB_00107f8d;
        }
        pcVar11 = *(char **)(c[1].request_method + 0xa0);
        local_a2f0 = st;
        sVar10 = strlen(path);
        lVar22 = 0;
        while ((-lVar22 != sVar10 && (path[lVar22 + sVar10 + -1] == '/'))) {
          lVar22 = lVar22 + -1;
        }
        local_a2d0 = path + lVar22 + sVar10 + 1;
        path[lVar22 + sVar10] = '/';
        local_a2f8 = extra_headers;
        do {
          do {
            pcVar11 = next_option(pcVar11,(vec *)dir,(vec *)0x0);
            if (pcVar11 == (char *)0x0) {
              path[lVar22 + sVar10] = '\0';
              iVar7 = mg_strcasecmp(local_a2c8,"yes");
              if (iVar7 == 0) {
                _minute = (dir_entry *)0x0;
                if (c->query_string == (char *)0x0) {
                  uVar20 = 100;
                }
                else {
                  uVar20 = (ulong)((uint)(c->query_string[1] != 'd') * 3 + 0x61);
                }
                mg_send_header(c,"Transfer-Encoding","chunked");
                mg_send_header(c,"Content-Type","text/html; charset=utf-8");
                mg_printf_data(c,
                               "<html><head><title>Index of %s</title><style>th {text-align: left;}</style></head><body><h1>Index of %s</h1><pre><table cellpadding=\"0\"><tr><th><a href=\"?n%c\">Name</a></th><th><a href=\"?d%c\">Modified</a></th><th><a href=\"?s%c\">Size</a></th></tr><tr><td colspan=\"3\"><hr></td></tr>"
                               ,c->uri,c->uri,uVar20,uVar20,uVar20);
                uVar9 = scan_directory((connection *)conn,path,(dir_entry **)&minute);
                __ptr = _minute;
                qsort(_minute,(long)(int)uVar9,0xa0,compare_dir_entries);
                uVar20 = 0;
                if (0 < (int)uVar9) {
                  uVar20 = (ulong)uVar9;
                }
                __timer = &(__ptr->st).st_mtime;
                while (bVar23 = uVar20 != 0, uVar20 = uVar20 - 1, bVar23) {
                  if ((*(uint *)(__timer + -8) & 0xf000) == 0x4000) {
                    mg_snprintf(dir,0x40,"%s","[DIRECTORY]");
                    pcVar17 = "/";
                  }
                  else {
                    uVar4 = __timer[-5];
                    if ((long)uVar4 < 0x400) {
                      mg_snprintf(dir,0x40,"%d");
                    }
                    else {
                      dVar6 = (double)(long)uVar4;
                      if (uVar4 < 0x100000) {
                        uVar24 = SUB84(dVar6 * 0.0009765625,0);
                        pcVar17 = "%.1fk";
                      }
                      else if (uVar4 < 0x40000000) {
                        uVar24 = SUB84(dVar6 * 9.5367431640625e-07,0);
                        pcVar17 = "%.1fM";
                      }
                      else {
                        uVar24 = SUB84(dVar6 * 9.313225746154785e-10,0);
                        pcVar17 = "%.1fG";
                      }
                      mg_snprintf(dir,0x40,pcVar17,uVar24);
                    }
                    pcVar17 = "";
                  }
                  __tp = localtime(__timer);
                  strftime((char *)&second,0x40,"%d-%b-%Y %H:%M",__tp);
                  pcVar11 = (char *)__timer[-0xc];
                  sVar10 = strlen(pcVar11);
                  mg_url_encode(pcVar11,sVar10,(char *)&st_1,0x6000);
                  mg_printf_data((mg_connection *)(__timer[-0xd] + 8),
                                 "<tr><td><a href=\"%s%s\">%s%s</a></td><td>&nbsp;%s</td><td>&nbsp;&nbsp;%s</td></tr>\n"
                                 ,&st_1,pcVar17,pcVar11,pcVar17,&second,(vec *)dir);
                  free((void *)__timer[-0xc]);
                  __timer = __timer + 0x14;
                }
                free(__ptr);
                write_terminating_chunk((connection *)conn);
                goto LAB_00107f8d;
              }
              iVar7 = 0x193;
              goto LAB_00107b8a;
            }
            sVar18 = (size_t)(int)dir._8_4_;
          } while ((0x1ffe - (int)sVar10) - (int)lVar22 < (int)dir._8_4_);
          strncpy(local_a2d0,(char *)dir._0_8_,sVar18);
          path[lVar22 + sVar18 + sVar10 + 1] = '\0';
          iVar7 = stat64(path,(stat64 *)&st_1);
          st = local_a2f0;
        } while (iVar7 != 0);
        memcpy(local_a2f0,&st_1,0x90);
        extra_headers = local_a2f8;
      }
      local_a2f0 = st;
      sVar10 = strlen(pcVar17);
      iVar7 = mg_match_prefix(pcVar17,(int)sVar10,path);
      if (0 < iVar7) {
        pcVar17 = c[1].request_method;
        local_3e30._0_4_ = 0;
        local_3e30._4_4_ = 0;
        st_1.st_dev = (__dev_t)c;
        pcVar12 = getenv("SERVER_NAME");
        pcVar11 = c->local_ip;
        if (pcVar12 != (char *)0x0) {
          pcVar11 = pcVar12;
        }
        addenv((cgi_env_block *)&st_1,"SERVER_NAME=%s",pcVar11);
        addenv((cgi_env_block *)&st_1,"SERVER_ROOT=%s",*(undefined8 *)(pcVar17 + 0x68));
        addenv((cgi_env_block *)&st_1,"DOCUMENT_ROOT=%s",*(undefined8 *)(pcVar17 + 0x68));
        addenv((cgi_env_block *)&st_1,"SERVER_SOFTWARE=%s/%s","Mongoose","5.4");
        addenv((cgi_env_block *)&st_1,"%s","GATEWAY_INTERFACE=CGI/1.1");
        addenv((cgi_env_block *)&st_1,"%s","SERVER_PROTOCOL=HTTP/1.1");
        addenv((cgi_env_block *)&st_1,"%s","REDIRECT_STATUS=200");
        addenv((cgi_env_block *)&st_1,"REQUEST_METHOD=%s",c->request_method);
        addenv((cgi_env_block *)&st_1,"REMOTE_ADDR=%s",c->remote_ip);
        addenv((cgi_env_block *)&st_1,"REMOTE_PORT=%d",(ulong)c->remote_port);
        pcVar17 = c->query_string;
        pcVar11 = "?";
        if (pcVar17 == (char *)0x0) {
          pcVar11 = "";
        }
        local_a308 = "";
        if (pcVar17 == (char *)0x0) {
          pcVar17 = "";
        }
        addenv((cgi_env_block *)&st_1,"REQUEST_URI=%s%s%s",c->uri,pcVar11,pcVar17);
        pcVar17 = c[1].query_string;
        if (pcVar17 == (char *)0x0) {
          pcVar11 = strrchr(path,0x2f);
          pcVar17 = c->uri;
          pcVar12 = strrchr(pcVar17,0x2f);
          uVar9 = (int)pcVar12 - (int)pcVar17;
          if (pcVar12 == (char *)0x0) {
            uVar9 = 0;
          }
          if (pcVar11 == (char *)0x0) {
            pcVar11 = path;
          }
          addenv((cgi_env_block *)&st_1,"SCRIPT_NAME=%.*s%s",(ulong)uVar9,pcVar17,pcVar11);
        }
        else {
          pcVar11 = c->uri;
          sVar10 = strlen(pcVar11);
          sVar18 = strlen(pcVar17);
          addenv((cgi_env_block *)&st_1,"SCRIPT_NAME=%.*s",(ulong)(uint)((int)sVar10 - (int)sVar18),
                 pcVar11);
          addenv((cgi_env_block *)&st_1,"PATH_INFO=%s",c[1].query_string);
        }
        addenv((cgi_env_block *)&st_1,"SCRIPT_FILENAME=%s",path);
        addenv((cgi_env_block *)&st_1,"PATH_TRANSLATED=%s",path);
        pcVar17 = "on";
        if (*(long *)((long)c[-1].callback_param + 0x68) == 0) {
          pcVar17 = "off";
        }
        addenv((cgi_env_block *)&st_1,"HTTPS=%s",pcVar17);
        pcVar17 = mg_get_header(c,"Content-Type");
        if (pcVar17 != (char *)0x0) {
          addenv((cgi_env_block *)&st_1,"CONTENT_TYPE=%s",pcVar17);
        }
        if (c->query_string != (char *)0x0) {
          addenv((cgi_env_block *)&st_1,"QUERY_STRING=%s");
        }
        pcVar17 = mg_get_header(c,"Content-Length");
        if (pcVar17 != (char *)0x0) {
          addenv((cgi_env_block *)&st_1,"CONTENT_LENGTH=%s",pcVar17);
        }
        addenv2((cgi_env_block *)&st_1,"PATH");
        addenv2((cgi_env_block *)&st_1,"TMP");
        addenv2((cgi_env_block *)&st_1,"TEMP");
        addenv2((cgi_env_block *)&st_1,"TMPDIR");
        addenv2((cgi_env_block *)&st_1,"PERLLIB");
        addenv2((cgi_env_block *)&st_1,"MONGOOSE_CGI");
        addenv2((cgi_env_block *)&st_1,"LD_LIBRARY_PATH");
        lVar22 = 0;
LAB_00108177:
        if (c->num_headers <= lVar22) {
          lVar22 = (long)local_3e30._4_4_;
          local_3e30._4_4_ = local_3e30._4_4_ + 1;
          local_4030[lVar22] = 0;
          lVar22 = (long)(int)(uint)local_3e30;
          local_3e30._0_4_ = (uint)local_3e30 + 1;
          *(undefined1 *)((long)st_1.__glibc_reserved + lVar22 + -0x70) = 0;
          if (0x3f < local_3e30._4_4_) {
            __assert_fail("blk->nvars < (int) ARRAY_SIZE(blk->vars)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ProjetoHotSpot[P]UaiFai/lib/mongoose.c"
                          ,0x889,
                          "void prepare_cgi_environment(struct connection *, const char *, struct cgi_env_block *)"
                         );
          }
          if ((int)(uint)local_3e30 < 1) {
            __assert_fail("blk->len > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ProjetoHotSpot[P]UaiFai/lib/mongoose.c"
                          ,0x88a,
                          "void prepare_cgi_environment(struct connection *, const char *, struct cgi_env_block *)"
                         );
          }
          if (0x1fff < (uint)local_3e30) {
            __assert_fail("blk->len < (int) sizeof(blk->buf)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ProjetoHotSpot[P]UaiFai/lib/mongoose.c"
                          ,0x88b,
                          "void prepare_cgi_environment(struct connection *, const char *, struct cgi_env_block *)"
                         );
          }
          pcVar17 = strrchr(path,0x2f);
          if (pcVar17 == (char *)0x0) {
            mg_snprintf(dir,0x2000,"%s",".");
          }
          else {
            mg_snprintf(dir,0x2000,"%.*s",(ulong)(uint)((int)pcVar17 - (int)path));
          }
          do {
            ns_socketpair(&minute);
          } while (minute == -1);
          pcVar17 = *(char **)(c[1].request_method + 0x50);
          _Var8 = fork();
          if (_Var8 != 0) {
            *(undefined4 *)&c[1].http_version = 2;
            pnVar15 = ns_add_sock((ns_mgr *)c[1].request_method,minute,mg_ev_handler,conn);
            c[1].uri = (char *)pnVar15;
            pbVar13 = (byte *)((long)&pnVar15->flags + 2);
            *pbVar13 = *pbVar13 | 0x40;
            ns_out((ns_connection *)c[-1].callback_param,"HTTP/1.1 200 OK\r\n",0x11);
            c->status_code = 200;
            pvVar3 = c[-1].callback_param;
            *(uint *)((long)pvVar3 + 0x98) = *(uint *)((long)pvVar3 + 0x98) | 2;
            pcVar17 = c[1].uri;
            uVar5 = *(undefined8 *)((long)pvVar3 + 0x40);
            *(undefined8 *)(pcVar17 + 0x50) = *(undefined8 *)((long)pvVar3 + 0x38);
            *(undefined8 *)(pcVar17 + 0x58) = uVar5;
            *(undefined8 *)(pcVar17 + 0x60) = *(undefined8 *)((long)pvVar3 + 0x48);
            iobuf_init((iobuf *)((long)c[-1].callback_param + 0x38),0);
            close(iStack_a2b4);
            return;
          }
          chdir(dir);
          dup2(iStack_a2b4,0);
          dup2(iStack_a2b4,1);
          close(iStack_a2b4);
          __sysv_signal(0x11,(__sighandler_t)0x0);
          if (pcVar17 == (char *)0x0) {
            execle(path,path,0,local_4030);
            pcVar17 = "";
          }
          else {
            execle(pcVar17,pcVar17,path,0,local_4030);
            local_a308 = " ";
          }
          piVar16 = __errno_location();
          pcVar11 = strerror(*piVar16);
          snprintf((char *)&second,500,"Status: 500\r\n\r\n500 Server Error: %s%s%s: %s",pcVar17,
                   local_a308,path,pcVar11);
          sVar10 = strlen((char *)&second);
          send(1,&second,sVar10,0);
          exit(1);
        }
        pbVar13 = (byte *)addenv((cgi_env_block *)&st_1,"HTTP_%s=%s",c->http_headers[lVar22].name,
                                 c->http_headers[lVar22].value);
        do {
          bVar2 = *pbVar13;
          uVar20 = (ulong)bVar2;
          if (bVar2 == 0x2d) {
            *pbVar13 = 0x5f;
            uVar20 = 0x5f;
          }
          else if ((bVar2 == 0) || (bVar2 == 0x3d)) goto LAB_001081db;
          pp_Var14 = __ctype_toupper_loc();
          *pbVar13 = *(byte *)(*pp_Var14 + uVar20);
          pbVar13 = pbVar13 + 1;
        } while( true );
      }
      pcVar17 = *(char **)(c[1].request_method + 0xb8);
      sVar10 = strlen(pcVar17);
      iVar7 = mg_match_prefix(pcVar17,(int)sVar10,path);
      if (0 < iVar7) {
        __stream = fopen64(path,"rb");
        if (__stream == (FILE *)0x0) {
          piVar16 = __errno_location();
          pcVar17 = strerror(*piVar16);
          send_http_error((connection *)conn,500,"fopen(%s): %s",path,pcVar17);
          return;
        }
        iVar7 = fileno(__stream);
        ns_set_close_on_exec(iVar7);
        get_mime_type((mg_server *)c[1].request_method,path,(vec *)&st_1);
        c->status_code = 200;
        mg_printf(c,"HTTP/1.1 %d OK\r\nContent-Type: %.*s\r\nConnection: close\r\n\r\n",200,
                  (ulong)(uint)st_1.st_ino,st_1.st_dev);
        send_ssi_file(c,path,(FILE *)__stream,0);
        fclose(__stream);
LAB_00107f8d:
        close_local_endpoint((connection *)conn);
        return;
      }
      pcVar17 = mg_get_header(c,"If-Modified-Since");
      pcVar11 = mg_get_header(c,"If-None-Match");
      buf_len = local_a2f0;
      construct_etag((char *)&st_1,(size_t)local_a2f0,st_00);
      if ((pcVar11 != (char *)0x0) && (iVar7 = mg_strcasecmp((char *)&st_1,pcVar11), iVar7 == 0)) {
LAB_00108913:
        iVar7 = 0x130;
        goto LAB_00107b8a;
      }
      if (pcVar17 != (char *)0x0) {
        lVar22 = buf_len->st_mtime;
        iVar7 = __isoc99_sscanf(pcVar17,"%d/%3s/%d %d:%d:%d",&day,dir,&curtime,&hour,&minute,&second
                               );
        if (((iVar7 == 6) ||
            (iVar7 = __isoc99_sscanf(pcVar17,"%d %3s %d %d:%d:%d",&day,dir,&curtime,&hour,&minute,
                                     &second), iVar7 == 6)) ||
           (iVar7 = __isoc99_sscanf(pcVar17,"%*3s, %d %3s %d %d:%d:%d",&day,dir,&curtime,&hour,
                                    &minute,&second), iVar7 == 6)) {
          if (0x7b2 < (int)curtime) goto LAB_0010849d;
          lVar21 = 0;
        }
        else {
          lVar21 = 0;
          iVar7 = __isoc99_sscanf(pcVar17,"%d-%3s-%d %d:%d:%d",&day,dir,&curtime,&hour,&minute,
                                  &second);
          if (iVar7 == 6 && 0x7b2 < (int)curtime) {
LAB_0010849d:
            lVar21 = 0;
            piVar16 = &get_month_index_month_names_rel;
            local_a2f8 = extra_headers;
            for (lVar19 = 0; extra_headers = local_a2f8, lVar19 != 0x18; lVar19 = lVar19 + 2) {
              iVar7 = strcmp(dir,(char *)((long)&get_month_index_month_names_rel + (long)*piVar16));
              if (iVar7 == 0) {
                lVar21 = (long)second + (long)minute * 0x3c + (long)hour * 0xe10 +
                         (long)(int)(((int)curtime / 400 + (int)curtime / -100 +
                                      (int)curtime * 0x16d + (int)curtime / 4 +
                                      (uint)*(ushort *)
                                             ((long)&parse_date_string_days_before_month + lVar19) +
                                     day) * 0x15180 + -0x79747c00);
                extra_headers = local_a2f8;
                break;
              }
              piVar16 = piVar16 + 1;
            }
          }
        }
        buf_len = local_a2f0;
        if (lVar22 <= lVar21) goto LAB_00108913;
      }
      iVar7 = open64(path,0,0);
      *(int *)&c[1].uri = iVar7;
      if (iVar7 != -1) {
        curtime = time((time_t *)0x0);
        *(undefined4 *)&c[1].http_version = 1;
        ns_set_close_on_exec(*(sock_t *)&c[1].uri);
        c->status_code = 200;
        get_mime_type((mg_server *)c[1].request_method,path,(vec *)&day);
        *(__off_t *)(c[1].remote_ip + 0x10) = buf_len->st_size;
        r2 = 0;
        hour = hour & 0xffffff00;
        r1 = 0;
        pcVar17 = mg_get_header(c,"Range");
        pcVar11 = "OK";
        t = extraout_RDX;
        if (pcVar17 != (char *)0x0) {
          iVar7 = parse_range_header(pcVar17,&r1,&r2);
          t = (time_t *)
              CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),-1 < r2 && (-1 < r1 && 0 < iVar7));
          if (-1 < r2 && (-1 < r1 && 0 < iVar7)) {
            c->status_code = 0xce;
            lVar22 = *(long *)(c[1].remote_ip + 0x10);
            if (iVar7 == 2) {
              if (r2 < lVar22) {
                lVar22 = r2;
              }
              lVar22 = (lVar22 - r1) + 1;
            }
            else {
              lVar22 = lVar22 - r1;
            }
            *(long *)(c[1].remote_ip + 0x10) = lVar22;
            mg_snprintf((char *)&hour,0x40,"Content-Range: bytes %ld-%ld/%ld\r\n",r1,
                        r1 + lVar22 + -1,buf_len->st_size);
            lseek64(*(int *)&c[1].uri,r1,0);
            pcVar11 = "Partial Content";
            t = extraout_RDX_01;
          }
        }
        gmt_time_string(dir,(size_t)&curtime,t);
        gmt_time_string((char *)&second,(size_t)&buf_len->st_mtime,t_00);
        construct_etag((char *)&minute,(size_t)buf_len,st_01);
        uVar9 = c->status_code;
        uVar5 = *(undefined8 *)(c[1].remote_ip + 0x10);
        iVar7 = should_keep_alive(c);
        pcVar17 = "keep-alive";
        if (iVar7 == 0) {
          pcVar17 = "close";
        }
        if (extra_headers == (char *)0x0) {
          extra_headers = "";
        }
        iVar7 = mg_snprintf((char *)&st_1,1000,
                            "HTTP/1.1 %d %s\r\nDate: %s\r\nLast-Modified: %s\r\nEtag: %s\r\nContent-Type: %.*s\r\nContent-Length: %ld\r\nConnection: %s\r\nAccept-Ranges: bytes\r\n%s%s%s\r\n"
                            ,(ulong)uVar9,pcVar11,dir,&second,&minute,(ulong)local_a2e0,
                            CONCAT44(uStack_a2e4,day),uVar5,pcVar17,&hour,extra_headers,"");
        ns_send((ns_connection *)c[-1].callback_param,&st_1,iVar7);
        iVar7 = strcmp(c->request_method,"HEAD");
        if (iVar7 != 0) {
          return;
        }
        puVar1 = (uint *)((long)c[-1].callback_param + 0x98);
        *puVar1 = *puVar1 | 1;
        close(*(int *)&c[1].uri);
        *(undefined4 *)&c[1].http_version = 0;
        return;
      }
    }
  }
  iVar7 = 0x194;
LAB_00107b8a:
  send_http_error((connection *)conn,iVar7,(char *)0x0);
  return;
LAB_001081db:
  lVar22 = lVar22 + 1;
  goto LAB_00108177;
}

Assistant:

void mg_send_file_internal(struct mg_connection *c, const char *file_name,
                           file_stat_t *st, int exists,
                           const char *extra_headers) {
  struct connection *conn = MG_CONN_2_CONN(c);
  char path[MAX_PATH_SIZE];
  const int is_directory = S_ISDIR(st->st_mode);
#ifndef MONGOOSE_NO_CGI
  const char *cgi_pat = conn->server->config_options[CGI_PATTERN];
#else
  const char *cgi_pat = DEFAULT_CGI_PATTERN;
#endif
#ifndef MONGOOSE_NO_DIRECTORY_LISTING
  const char *dir_lst = conn->server->config_options[ENABLE_DIRECTORY_LISTING];
#else
  const char *dir_lst = "yes";
#endif

  mg_snprintf(path, sizeof(path), "%s", file_name);

  if (!exists || must_hide_file(conn, path)) {
    send_http_error(conn, 404, NULL);
  } else if (is_directory &&
             conn->mg_conn.uri[strlen(conn->mg_conn.uri) - 1] != '/') {
    conn->mg_conn.status_code = 301;
    mg_printf(&conn->mg_conn, "HTTP/1.1 301 Moved Permanently\r\n"
              "Location: %s/\r\n\r\n", conn->mg_conn.uri);
    close_local_endpoint(conn);
  } else if (is_directory && !find_index_file(conn, path, sizeof(path), st)) {
    if (!mg_strcasecmp(dir_lst, "yes")) {
#ifndef MONGOOSE_NO_DIRECTORY_LISTING
      send_directory_listing(conn, path);
#else
      send_http_error(conn, 501, NULL);
#endif
    } else {
      send_http_error(conn, 403, NULL);
    }
  } else if (mg_match_prefix(cgi_pat, strlen(cgi_pat), path) > 0) {
#if !defined(MONGOOSE_NO_CGI)
    open_cgi_endpoint(conn, path);
#else
    send_http_error(conn, 501, NULL);
#endif // !MONGOOSE_NO_CGI
#ifndef MONGOOSE_NO_SSI
  } else if (mg_match_prefix(conn->server->config_options[SSI_PATTERN],
                             strlen(conn->server->config_options[SSI_PATTERN]),
                             path) > 0) {
    handle_ssi_request(conn, path);
#endif
  } else if (is_not_modified(conn, st)) {
    send_http_error(conn, 304, NULL);
  } else if ((conn->endpoint.fd = open(path, O_RDONLY | O_BINARY, 0)) != -1) {
    // O_BINARY is required for Windows, otherwise in default text mode
    // two bytes \r\n will be read as one.
    open_file_endpoint(conn, path, st, extra_headers);
  } else {
    send_http_error(conn, 404, NULL);
  }
}